

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O1

void __thiscall
glcts::TextureBufferActiveUniformValidationCS::createProgram
          (TextureBufferActiveUniformValidationCS *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_00;
  char *csCode;
  char *local_20;
  long lVar5;
  
  iVar2 = (*((this->super_TextureBufferActiveUniformValidation).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar5 + 0x3c8))();
  (this->super_TextureBufferActiveUniformValidation).m_po_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0x296);
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x91b9);
  this->m_cs_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error creating shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0x299);
  local_20 = 
  "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nlayout(r32f)  uniform highp imageBuffer    image_buffer;\nlayout(r32i)  uniform highp iimageBuffer   iimage_buffer;\nlayout(r32ui) uniform highp uimageBuffer   uimage_buffer;\n\nlayout (local_size_x = 1) in;\n\nvoid main(void)\n{\n    imageStore(image_buffer,  0, vec4 (1.0, 1.0, 1.0, 1.0));\n    imageStore(iimage_buffer, 0, ivec4(1,   1,   1,   1)  );\n    imageStore(uimage_buffer, 0, uvec4(1,   1,   1,   1)  );\n}\n"
  ;
  bVar1 = TestCaseBase::buildProgram
                    ((TestCaseBase *)this,(this->super_TextureBufferActiveUniformValidation).m_po_id
                     ,this->m_cs_id,1,&local_20,(bool *)0x0);
  if (bVar1) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Error building a program!",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
             ,0x29f);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferActiveUniformValidationCS::createProgram(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

	const char* csCode = getComputeShaderCode();

	if (!buildProgram(m_po_id, m_cs_id, 1, &csCode))
	{
		TCU_FAIL("Error building a program!");
	}
}